

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

uint GetSplitCopyCount(VmInstruction *inst,uint marker)

{
  VmValue *pVVar1;
  VmInstruction *pVVar2;
  uint uVar3;
  VmInstructionType VVar4;
  VmValue **ppVVar5;
  VmValue *pVVar6;
  VmValueType index;
  uint uVar7;
  VmInstruction *pVVar8;
  uint argument;
  uint uVar9;
  
  uVar7 = 0;
  if (inst->regVmSearchMarker != marker) {
    inst->regVmSearchMarker = marker;
    VVar4 = inst->cmd;
    uVar7 = 0;
    if (VVar4 == VM_INST_PHI) {
      uVar7 = 0;
      for (uVar9 = 0; uVar9 < (inst->arguments).count; uVar9 = uVar9 + 2) {
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,uVar9);
        pVVar8 = (VmInstruction *)*ppVVar5;
        if ((pVVar8 == (VmInstruction *)0x0) || ((pVVar8->super_VmValue).typeID != 2)) {
          pVVar8 = (VmInstruction *)0x0;
        }
        uVar3 = GetSplitCopyCount(pVVar8,marker);
        uVar7 = uVar7 + uVar3;
      }
      VVar4 = inst->cmd;
    }
    if (VVar4 == VM_INST_MOV) {
      ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
      pVVar6 = *ppVVar5;
      if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 2)) {
        pVVar6 = (VmValue *)0x0;
      }
      if (inst->color != 0) {
        uVar7 = uVar7 + (inst->color == *(uint *)(pVVar6[1].users.little + 7));
      }
    }
    if (inst->cmd == VM_INST_DEF) {
      for (uVar9 = 0; uVar9 < (inst->super_VmValue).users.count; uVar9 = uVar9 + 1) {
        ppVVar5 = SmallArray<VmValue_*,_8U>::operator[](&(inst->super_VmValue).users,uVar9);
        pVVar6 = *ppVVar5;
        if (((pVVar6 != (VmValue *)0x0) && (pVVar6->typeID == 2)) &&
           (*(int *)&pVVar6[1]._vptr_VmValue == 0x51)) {
          for (index = VM_TYPE_VOID; index < pVVar6[1].type.type; index = index + VM_TYPE_DOUBLE) {
            ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&pVVar6[1].typeID,index);
            pVVar8 = (VmInstruction *)*ppVVar5;
            if ((pVVar8 == (VmInstruction *)0x0) || ((pVVar8->super_VmValue).typeID != 2)) {
              pVVar8 = (VmInstruction *)0x0;
            }
            ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&pVVar6[1].typeID,index + VM_TYPE_INT)
            ;
            pVVar1 = *ppVVar5;
            if ((pVVar1 == (VmValue *)0x0) || (pVVar1->typeID != 2)) {
              if (pVVar8 != (VmInstruction *)0x0) {
                __assert_fail("source",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1c94,
                              "unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
              }
LAB_0025ada8:
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c93,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
            if (pVVar8 == (VmInstruction *)0x0) goto LAB_0025ada8;
            if ((pVVar8 == inst) && (inst->color != 0)) {
              uVar7 = uVar7 + (inst->color == *(uint *)(pVVar1[1].users.little + 7));
            }
          }
        }
      }
    }
    for (uVar9 = 0; uVar9 < (inst->super_VmValue).users.count; uVar9 = uVar9 + 1) {
      ppVVar5 = SmallArray<VmValue_*,_8U>::operator[](&(inst->super_VmValue).users,uVar9);
      pVVar8 = (VmInstruction *)*ppVVar5;
      if ((pVVar8 == (VmInstruction *)0x0) || ((pVVar8->super_VmValue).typeID != 2)) {
        pVVar8 = (VmInstruction *)0x0;
      }
      VVar4 = pVVar8->cmd;
      if (VVar4 == VM_INST_PHI) {
        uVar3 = GetSplitCopyCount(pVVar8,marker);
        uVar7 = uVar7 + uVar3;
        VVar4 = pVVar8->cmd;
      }
      if (VVar4 == VM_INST_MOV) {
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar8->arguments,0);
        if ((VmInstruction *)*ppVVar5 != inst) {
          __assert_fail("inst == instruction->arguments[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1ca9,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
        }
        if (pVVar8->color != 0) {
          uVar7 = uVar7 + (pVVar8->color == inst->color);
        }
      }
      if (pVVar8->cmd == VM_INST_PARALLEL_COPY) {
        for (uVar3 = 0; uVar3 < (pVVar8->arguments).count; uVar3 = uVar3 + 2) {
          ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar8->arguments,uVar3);
          pVVar6 = *ppVVar5;
          if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 2)) {
            pVVar6 = (VmValue *)0x0;
          }
          ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar8->arguments,uVar3 + 1);
          pVVar2 = (VmInstruction *)*ppVVar5;
          if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
            if (pVVar6 != (VmValue *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1cb7,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)")
              ;
            }
LAB_0025ad65:
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1cb6,"unsigned int GetSplitCopyCount(VmInstruction *, unsigned int)");
          }
          if (pVVar6 == (VmValue *)0x0) goto LAB_0025ad65;
          if ((pVVar2 == inst) && (pVVar8->color != 0)) {
            uVar7 = uVar7 + (pVVar8->color == *(uint *)(pVVar6[1].users.little + 7));
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

unsigned GetSplitCopyCount(VmInstruction *inst, unsigned marker)
{
	if(inst->regVmSearchMarker == marker)
		return 0;

	inst->regVmSearchMarker = marker;

	unsigned count = 0;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			count += GetSplitCopyCount(instruction, marker);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		if(inst->color != 0 && inst->color == instruction->color)
			count++;
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
					{
						if(inst->color != 0 && inst->color == source->color)
							count++;
					}
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			count += GetSplitCopyCount(instruction, marker);

		if(instruction->cmd == VM_INST_MOV)
		{
			assert(inst == instruction->arguments[0]);

			if(instruction->color != 0 && instruction->color == inst->color)
				count++;
		}

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
				{
					if(instruction->color != 0 && instruction->color == destination->color)
						count++;
				}
			}
		}
	}

	return count;
}